

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::format_uint<1u,char,fmt::v9::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  type tVar1;
  char *buffer_00;
  int in_ECX;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  char local_f8 [8];
  char buffer [129];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  appender out_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  buffer_00 = to_pointer<char>((buffer_appender<char>)
                               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    value_01._8_8_ = in_stack_fffffffffffffef0;
    value_01._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>(local_f8,(unsigned___int128)value_01,num_digits,upper);
    out_local = copy_str_noinline<char,char*,fmt::v9::appender>(local_f8,local_f8 + in_ECX,out);
  }
  else {
    value_00._8_8_ = in_stack_fffffffffffffef0;
    value_00._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>(buffer_00,(unsigned___int128)value_00,num_digits,upper);
    out_local.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}